

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Scene::~Scene(Scene *this)

{
  XFormWidget *this_00;
  Scene *this_local;
  
  if ((this->elementTransform != (XFormWidget *)0x0) &&
     (this_00 = this->elementTransform, this_00 != (XFormWidget *)0x0)) {
    XFormWidget::~XFormWidget(this_00);
    operator_delete(this_00,0x218);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->selectionInfo);
  std::
  set<CMU462::DynamicScene::SceneLight_*,_std::less<CMU462::DynamicScene::SceneLight_*>,_std::allocator<CMU462::DynamicScene::SceneLight_*>_>
  ::~set(&this->lights);
  std::
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  ::~set(&this->objects);
  return;
}

Assistant:

Scene::~Scene()
{
   if( elementTransform != nullptr )
   {
      delete elementTransform;
   }
}